

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O2

bool __thiscall add_data::before(add_data *this,coro_http_request *req,coro_http_response *res)

{
  shared_ptr<int> val;
  shared_ptr<int> local_30;
  any local_20;
  
  cinatra::coro_http_request::set_aspect_data<char_const*>(req,"hello world");
  std::make_shared<int,int>((int *)&local_30);
  std::any::
  any<std::shared_ptr<int>&,std::shared_ptr<int>,std::any::_Manager_external<std::shared_ptr<int>>,void>
            (&local_20,&local_30);
  std::any::operator=(&req->user_data_,&local_20);
  std::any::reset(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return true;
}

Assistant:

bool before(coro_http_request &req, coro_http_response &res) {
    req.set_aspect_data("hello world");
    auto val = std::make_shared<int>(42);
    req.set_user_data(val);
    return true;
  }